

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O0

void __thiscall
wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::
unlinkDeadBlocks(CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                 *this,unordered_set<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
                       *alive)

{
  bool bVar1;
  size_type sVar2;
  pointer pBVar3;
  pointer pBVar4;
  __normal_iterator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
  local_b8;
  const_iterator local_b0;
  unordered_set<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
  *local_a8;
  BasicBlock **local_a0;
  __normal_iterator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
  local_98;
  __normal_iterator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
  local_90;
  const_iterator local_88;
  BasicBlock **local_80;
  __normal_iterator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
  local_78;
  const_iterator local_70;
  unordered_set<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
  *local_68;
  BasicBlock **local_60;
  __normal_iterator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
  local_58;
  __normal_iterator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
  local_50;
  const_iterator local_48;
  pointer local_40;
  reference local_38;
  unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>
  *block;
  iterator __end0;
  iterator __begin0;
  vector<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
  *__range2;
  unordered_set<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
  *alive_local;
  CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
  *this_local;
  
  __end0 = std::
           vector<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
           ::begin(&this->basicBlocks);
  block = (unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>
           *)std::
             vector<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
             ::end(&this->basicBlocks);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>_*,_std::vector<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>_>_>_>
                                *)&block);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>_*,_std::vector<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>_>_>_>
               ::operator*(&__end0);
    local_40 = std::
               unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>
               ::get(local_38);
    sVar2 = std::
            unordered_set<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
            ::count(alive,&local_40);
    if (sVar2 == 0) {
      pBVar3 = std::
               unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>
               ::operator->(local_38);
      std::
      vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ::clear(&pBVar3->in);
      pBVar3 = std::
               unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>
               ::operator->(local_38);
      std::
      vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ::clear(&pBVar3->out);
    }
    else {
      pBVar3 = std::
               unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>
               ::operator->(local_38);
      pBVar4 = std::
               unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>
               ::operator->(local_38);
      local_58._M_current =
           (BasicBlock **)
           std::
           vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
           ::begin(&pBVar4->in);
      pBVar4 = std::
               unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>
               ::operator->(local_38);
      local_60 = (BasicBlock **)
                 std::
                 vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
                 ::end(&pBVar4->in);
      local_68 = alive;
      local_50 = std::
                 remove_if<__gnu_cxx::__normal_iterator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock**,std::vector<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>>,wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>)::_lambda(wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*)_1_>
                           (local_58,(__normal_iterator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
                                      )local_60,(anon_class_8_1_a7a387ed_for__M_pred)alive);
      __gnu_cxx::
      __normal_iterator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*const*,std::vector<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>>
      ::
      __normal_iterator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock**>
                ((__normal_iterator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*const*,std::vector<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>>
                  *)&local_48,&local_50);
      pBVar4 = std::
               unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>
               ::operator->(local_38);
      local_78._M_current =
           (BasicBlock **)
           std::
           vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
           ::end(&pBVar4->in);
      __gnu_cxx::
      __normal_iterator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*const*,std::vector<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>>
      ::
      __normal_iterator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock**>
                ((__normal_iterator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*const*,std::vector<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>>
                  *)&local_70,&local_78);
      local_80 = (BasicBlock **)
                 std::
                 vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
                 ::erase(&pBVar3->in,local_48,local_70);
      pBVar3 = std::
               unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>
               ::operator->(local_38);
      pBVar4 = std::
               unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>
               ::operator->(local_38);
      local_98._M_current =
           (BasicBlock **)
           std::
           vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
           ::begin(&pBVar4->out);
      pBVar4 = std::
               unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>
               ::operator->(local_38);
      local_a0 = (BasicBlock **)
                 std::
                 vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
                 ::end(&pBVar4->out);
      local_a8 = alive;
      local_90 = std::
                 remove_if<__gnu_cxx::__normal_iterator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock**,std::vector<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>>,wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>)::_lambda(wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*)_2_>
                           (local_98,(__normal_iterator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
                                      )local_a0,(anon_class_8_1_a7a387ed_for__M_pred)alive);
      __gnu_cxx::
      __normal_iterator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*const*,std::vector<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>>
      ::
      __normal_iterator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock**>
                ((__normal_iterator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*const*,std::vector<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>>
                  *)&local_88,&local_90);
      pBVar4 = std::
               unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>
               ::operator->(local_38);
      local_b8._M_current =
           (BasicBlock **)
           std::
           vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
           ::end(&pBVar4->out);
      __gnu_cxx::
      __normal_iterator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*const*,std::vector<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>>
      ::
      __normal_iterator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock**>
                ((__normal_iterator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*const*,std::vector<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>>
                  *)&local_b0,&local_b8);
      std::
      vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ::erase(&pBVar3->out,local_88,local_b0);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>_*,_std::vector<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void unlinkDeadBlocks(std::unordered_set<BasicBlock*> alive) {
    for (auto& block : basicBlocks) {
      if (!alive.count(block.get())) {
        block->in.clear();
        block->out.clear();
        continue;
      }
      block->in.erase(std::remove_if(block->in.begin(),
                                     block->in.end(),
                                     [&alive](BasicBlock* other) {
                                       return !alive.count(other);
                                     }),
                      block->in.end());
      block->out.erase(std::remove_if(block->out.begin(),
                                      block->out.end(),
                                      [&alive](BasicBlock* other) {
                                        return !alive.count(other);
                                      }),
                       block->out.end());
    }
  }